

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  ushort *puVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  BYTE *s_1;
  ushort *puVar9;
  ushort *__src;
  long lVar10;
  int iVar11;
  ushort *puVar12;
  long lVar13;
  uint uVar14;
  char *pcVar15;
  long lVar16;
  uint uVar17;
  BYTE *e;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  ushort *puVar21;
  BYTE *d;
  ushort *puVar22;
  byte *pbVar23;
  BYTE *d_1;
  char *pcVar24;
  BYTE *s;
  byte *pbVar25;
  ulong uVar26;
  long lVar27;
  char *pcVar28;
  char *pcVar29;
  int local_40;
  
  iVar11 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar11 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      lVar16 = (long)maxOutputSize;
      if (0x3f < maxOutputSize) {
        lVar13 = 0;
        puVar21 = (ushort *)source;
LAB_0010f0b1:
        pcVar24 = dest + lVar13;
        __src = (ushort *)((long)puVar21 + 1);
        bVar4 = (byte)*puVar21;
        uVar17 = (uint)bVar4;
        uVar26 = (ulong)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010f682;
          puVar22 = puVar21 + 1;
          uVar14 = 0;
          puVar21 = puVar21 + 8;
          do {
            puVar12 = puVar21;
            puVar9 = __src;
            __src = (ushort *)((long)puVar9 + 1);
            uVar14 = uVar14 + *(byte *)((long)puVar12 + -0xf);
            puVar22 = (ushort *)((long)puVar22 + 1);
            puVar21 = (ushort *)((long)puVar12 + 1);
          } while (puVar12 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar12 + -0xf) == 0xff);
          uVar26 = (ulong)uVar14 + 0xf;
          if ((CARRY8((ulong)pcVar24,uVar26)) || ((ulong)-(long)puVar22 < uVar26)) {
            __src = puVar12 + -7;
            goto LAB_0010f682;
          }
          lVar10 = lVar13 + uVar26;
          if (dest + lVar16 + -0x20 < dest + lVar10) goto LAB_0010f4a7;
          puVar21 = (ushort *)((ulong)uVar14 + (long)puVar12 + 1);
          if (puVar1 + -0x10 < puVar21) {
            __src = puVar12 + -7;
            goto LAB_0010f4a7;
          }
          lVar13 = 0;
          do {
            uVar6 = *(undefined8 *)((byte *)((long)__src + lVar13) + 8);
            pcVar3 = pcVar24 + lVar13;
            *(undefined8 *)pcVar3 = *(undefined8 *)((long)__src + lVar13);
            *(undefined8 *)(pcVar3 + 8) = uVar6;
            pbVar23 = (byte *)((long)puVar9 + lVar13 + 0x11);
            uVar6 = *(undefined8 *)(pbVar23 + 8);
            *(undefined8 *)(pcVar3 + 0x10) = *(undefined8 *)pbVar23;
            *(undefined8 *)(pcVar3 + 0x18) = uVar6;
            lVar13 = lVar13 + 0x20;
          } while (pcVar3 + 0x20 < dest + lVar10);
        }
        else {
          lVar10 = lVar13 + uVar26;
          if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_0010f4a7;
          uVar6 = *(undefined8 *)((long)puVar21 + 9);
          *(undefined8 *)pcVar24 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar24 + 8) = uVar6;
          puVar21 = (ushort *)(uVar26 + (long)__src);
        }
        pbVar23 = (byte *)(dest + lVar10);
        uVar7 = *puVar21;
        uVar26 = (ulong)uVar7;
        __src = puVar21 + 1;
        lVar27 = lVar10 - uVar26;
        pbVar25 = (byte *)(dest + lVar27);
        uVar19 = (ulong)(bVar4 & 0xf);
        if (uVar19 == 0xf) {
          if (lVar27 < -0x10000) goto LAB_0010f682;
          uVar17 = 0;
          puVar21 = __src;
          do {
            __src = (ushort *)((long)puVar21 + 1);
            if (puVar1 + -2 <= __src) goto LAB_0010f682;
            uVar8 = *puVar21;
            uVar17 = uVar17 + (byte)uVar8;
            puVar21 = __src;
          } while ((byte)uVar8 == 0xff);
          uVar18 = (ulong)uVar17;
          if ((byte *)(-0x10 - uVar18) < pbVar23) goto LAB_0010f682;
          uVar19 = uVar18 + 0x13;
          if (dest + lVar16 + -0x40 <= pbVar23 + uVar18 + 0x13) goto LAB_0010f553;
LAB_0010f25e:
          if (lVar27 < -0x10000) goto LAB_0010f682;
          lVar13 = lVar10 + uVar19;
          pbVar2 = (byte *)(dest + lVar13);
          puVar21 = __src;
          if (0xf < uVar7) {
            do {
              uVar6 = *(undefined8 *)(pbVar23 + -uVar26 + 8);
              *(undefined8 *)pbVar23 = *(undefined8 *)(pbVar23 + -uVar26);
              *(undefined8 *)(pbVar23 + 8) = uVar6;
              uVar6 = *(undefined8 *)(pbVar23 + -uVar26 + 0x10 + 8);
              *(undefined8 *)(pbVar23 + 0x10) = *(undefined8 *)(pbVar23 + -uVar26 + 0x10);
              *(undefined8 *)(pbVar23 + 0x18) = uVar6;
              pbVar23 = pbVar23 + 0x20;
            } while (pbVar23 < pbVar2);
            goto LAB_0010f0b1;
          }
          if (uVar26 == 4) {
            iVar11 = *(int *)pbVar25;
          }
          else if (uVar7 == 2) {
            iVar11 = CONCAT22(*(undefined2 *)pbVar25,*(undefined2 *)pbVar25);
          }
          else {
            if (uVar7 != 1) {
              if (uVar7 < 8) {
                pbVar23[0] = 0;
                pbVar23[1] = 0;
                pbVar23[2] = 0;
                pbVar23[3] = 0;
                *pbVar23 = *pbVar25;
                pbVar23[1] = pbVar25[1];
                pbVar23[2] = pbVar25[2];
                pbVar23[3] = pbVar25[3];
                uVar17 = inc32table[uVar7];
                *(undefined4 *)(pbVar23 + 4) = *(undefined4 *)(pbVar25 + uVar17);
                pbVar25 = pbVar25 + ((ulong)uVar17 - (long)dec64table[uVar7]);
              }
              else {
                *(undefined8 *)pbVar23 = *(undefined8 *)pbVar25;
                pbVar25 = pbVar25 + 8;
              }
              pbVar23 = pbVar23 + 8;
              do {
                *(undefined8 *)pbVar23 = *(undefined8 *)pbVar25;
                pbVar23 = pbVar23 + 8;
                pbVar25 = pbVar25 + 8;
              } while (pbVar23 < pbVar2);
              goto LAB_0010f0b1;
            }
            iVar11 = (uint)*pbVar25 * 0x1010101;
          }
          do {
            *(int *)pbVar23 = iVar11;
            *(int *)(pbVar23 + 4) = iVar11;
            pbVar23 = pbVar23 + 8;
          } while (pbVar23 < pbVar2);
        }
        else {
          lVar13 = lVar10 + uVar19 + 4;
          uVar19 = uVar19 + 4;
          if (dest + lVar16 + -0x40 <= dest + lVar13) goto LAB_0010f553;
          if (uVar7 < 8) goto LAB_0010f25e;
          *(undefined8 *)pbVar23 = *(undefined8 *)pbVar25;
          *(undefined8 *)(pbVar23 + 8) = *(undefined8 *)(pbVar25 + 8);
          *(undefined2 *)(pbVar23 + 0x10) = *(undefined2 *)(pbVar25 + 0x10);
          puVar21 = __src;
        }
        goto LAB_0010f0b1;
      }
      lVar10 = 0;
      puVar21 = (ushort *)source;
      do {
        while( true ) {
          pcVar24 = dest + lVar10;
          __src = (ushort *)((long)puVar21 + 1);
          bVar4 = (byte)*puVar21;
          uVar17 = (uint)bVar4;
          uVar26 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) || (dest + lVar16 + -0x20 < pcVar24))
          goto LAB_0010f4a4;
          uVar6 = *(undefined8 *)((long)puVar21 + 9);
          *(undefined8 *)pcVar24 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar24 + 8) = uVar6;
          lVar10 = lVar10 + uVar26;
          uVar19 = (ulong)(bVar4 & 0xf);
          puVar21 = (ushort *)((long)__src + uVar26);
          __src = puVar21 + 1;
          uVar7 = *puVar21;
          lVar27 = lVar10 - (ulong)uVar7;
          if ((uVar19 == 0xf) || (uVar7 < 8)) goto LAB_0010f4f6;
          *(undefined8 *)(dest + lVar10) = *(undefined8 *)(dest + lVar27);
          *(undefined8 *)(dest + lVar10 + 8) = *(undefined8 *)(dest + lVar27 + 8);
          *(undefined2 *)(dest + lVar10 + 0x10) = *(undefined2 *)(dest + lVar27 + 0x10);
          lVar10 = lVar10 + uVar19 + 4;
          puVar21 = __src;
        }
        if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010f682;
        puVar21 = puVar21 + 1;
        uVar14 = 0;
        do {
          uVar7 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar14 = uVar14 + (byte)uVar7;
          puVar21 = (ushort *)((long)puVar21 + 1);
        } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar7 == 0xff);
        uVar26 = (ulong)uVar14 + 0xf;
        if ((CARRY8((ulong)pcVar24,uVar26)) || ((ulong)-(long)puVar21 < uVar26)) goto LAB_0010f682;
LAB_0010f4a4:
        lVar10 = lVar10 + uVar26;
LAB_0010f4a7:
        puVar21 = (ushort *)((long)__src + uVar26);
        if ((dest + lVar16 + -0xc < dest + lVar10) || (puVar1 + -4 < puVar21)) {
          if ((puVar21 == puVar1) && (lVar10 <= lVar16)) {
            memmove(pcVar24,__src,uVar26);
            return ((int)pcVar24 + (int)uVar26) - (int)dest;
          }
LAB_0010f682:
          local_40 = (int)source;
          return ~(uint)__src + local_40;
        }
        do {
          *(undefined8 *)pcVar24 = *(undefined8 *)__src;
          pcVar24 = pcVar24 + 8;
          __src = __src + 4;
        } while (pcVar24 < dest + lVar10);
        uVar7 = *puVar21;
        __src = puVar21 + 1;
        lVar27 = lVar10 - (ulong)uVar7;
        uVar19 = (ulong)(uVar17 & 0xf);
LAB_0010f4f6:
        if ((int)uVar19 == 0xf) {
          uVar17 = 0;
          do {
            uVar8 = *__src;
            __src = (ushort *)((long)__src + 1);
            uVar17 = uVar17 + (byte)uVar8;
          } while ((byte)uVar8 == 0xff && __src < puVar1 + -2);
          uVar19 = (ulong)uVar17 + 0xf;
          if ((puVar1 + -2 <= __src) || (CARRY8((ulong)(dest + lVar10),uVar19))) goto LAB_0010f682;
        }
        uVar19 = uVar19 + 4;
LAB_0010f553:
        if (lVar27 < -0x10000) goto LAB_0010f682;
        pcVar24 = dest + lVar10;
        pcVar28 = dest + lVar27;
        lVar10 = lVar10 + uVar19;
        pcVar3 = dest + lVar10;
        if (uVar7 < 8) {
          pcVar24[0] = '\0';
          pcVar24[1] = '\0';
          pcVar24[2] = '\0';
          pcVar24[3] = '\0';
          *pcVar24 = *pcVar28;
          pcVar24[1] = pcVar28[1];
          pcVar24[2] = pcVar28[2];
          pcVar24[3] = pcVar28[3];
          uVar17 = inc32table[uVar7];
          *(undefined4 *)(pcVar24 + 4) = *(undefined4 *)(pcVar28 + uVar17);
          pcVar28 = pcVar28 + ((ulong)uVar17 - (long)dec64table[uVar7]);
        }
        else {
          *(undefined8 *)pcVar24 = *(undefined8 *)pcVar28;
          pcVar28 = pcVar28 + 8;
        }
        pcVar15 = pcVar24 + 8;
        puVar21 = __src;
        if (dest + lVar16 + -0xc < pcVar3) {
          if (dest + lVar16 + -5 < pcVar3) goto LAB_0010f682;
          pcVar24 = dest + lVar16 + -7;
          pcVar20 = pcVar28;
          pcVar29 = pcVar15;
          if (pcVar15 < pcVar24) {
            do {
              *(undefined8 *)pcVar29 = *(undefined8 *)pcVar20;
              pcVar29 = pcVar29 + 8;
              pcVar20 = pcVar20 + 8;
            } while (pcVar29 < pcVar24);
            pcVar28 = pcVar28 + ((long)pcVar24 - (long)pcVar15);
            pcVar15 = pcVar24;
          }
          for (; pcVar15 < pcVar3; pcVar15 = pcVar15 + 1) {
            cVar5 = *pcVar28;
            pcVar28 = pcVar28 + 1;
            *pcVar15 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar15 = *(undefined8 *)pcVar28;
          if (0x10 < uVar19) {
            pcVar24 = pcVar24 + 0x10;
            do {
              pcVar28 = pcVar28 + 8;
              *(undefined8 *)pcVar24 = *(undefined8 *)pcVar28;
              pcVar24 = pcVar24 + 8;
            } while (pcVar24 < pcVar3);
          }
        }
      } while( true );
    }
  }
  return iVar11;
}

Assistant:

LZ4_FORCE_O2 /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}